

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btBox2dShape.cpp
# Opt level: O3

void __thiscall
btBox2dShape::getAabb(btBox2dShape *this,btTransform *t,btVector3 *aabbMin,btVector3 *aabbMax)

{
  float fVar1;
  undefined8 uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  float extraout_XMM0_Da;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  (*(this->super_btPolyhedralConvexShape).super_btConvexInternalShape.super_btConvexShape.
    super_btCollisionShape._vptr_btCollisionShape[0xc])();
  fVar7 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[0] + extraout_XMM0_Da;
  fVar9 = (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[1] + extraout_XMM0_Da;
  fVar5 = extraout_XMM0_Da +
          (this->super_btPolyhedralConvexShape).super_btConvexInternalShape.
          m_implicitShapeDimensions.m_floats[2];
  fVar1 = (t->m_origin).m_floats[2];
  fVar8 = ABS((t->m_basis).m_el[2].m_floats[2]) * fVar5 +
          ABS((t->m_basis).m_el[2].m_floats[0]) * fVar7 +
          ABS((t->m_basis).m_el[2].m_floats[1]) * fVar9;
  uVar2 = *(undefined8 *)(t->m_origin).m_floats;
  fVar6 = fVar5 * ABS((t->m_basis).m_el[0].m_floats[2]) +
          fVar7 * ABS((t->m_basis).m_el[0].m_floats[0]) +
          fVar9 * ABS((t->m_basis).m_el[0].m_floats[1]);
  fVar5 = fVar5 * ABS((t->m_basis).m_el[1].m_floats[2]) +
          fVar7 * ABS((t->m_basis).m_el[1].m_floats[0]) +
          fVar9 * ABS((t->m_basis).m_el[1].m_floats[1]);
  fVar7 = (float)uVar2;
  fVar9 = (float)((ulong)uVar2 >> 0x20);
  auVar4._4_4_ = fVar9 - fVar5;
  auVar4._0_4_ = fVar7 - fVar6;
  auVar4._8_4_ = fVar1 - fVar8;
  auVar4._12_4_ = 0;
  *(undefined1 (*) [16])aabbMin->m_floats = auVar4;
  auVar3._4_4_ = fVar5 + fVar9;
  auVar3._0_4_ = fVar6 + fVar7;
  auVar3._8_4_ = fVar8 + fVar1;
  auVar3._12_4_ = 0;
  *(undefined1 (*) [16])aabbMax->m_floats = auVar3;
  return;
}

Assistant:

void btBox2dShape::getAabb(const btTransform& t,btVector3& aabbMin,btVector3& aabbMax) const
{
	btTransformAabb(getHalfExtentsWithoutMargin(),getMargin(),t,aabbMin,aabbMax);
}